

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O1

bool __thiscall
QPDFNumberTreeObjectHelper::findObject
          (QPDFNumberTreeObjectHelper *this,numtree_number idx,QPDFObjectHandle *oh)

{
  bool bVar1;
  iterator i;
  iterator iStack_78;
  iterator local_48;
  
  find(&iStack_78,this,idx,false);
  end(&local_48,this);
  bVar1 = NNTreeIterator::operator==
                    (iStack_78.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,local_48.impl.
                            super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  iterator::~iterator(&local_48);
  if (!bVar1) {
    iterator::updateIValue(&iStack_78);
    (oh->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         iStack_78.ivalue.second.super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(oh->super_BaseHandle).obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&iStack_78.ivalue.second.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> + 8));
  }
  iterator::~iterator(&iStack_78);
  return !bVar1;
}

Assistant:

bool
QPDFNumberTreeObjectHelper::findObject(numtree_number idx, QPDFObjectHandle& oh)
{
    auto i = find(idx);
    if (i == end()) {
        return false;
    }
    oh = i->second;
    return true;
}